

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flvtag_amfcaption_utf8(flvtag_t *tag,uint32_t timestamp,utf8_char_t *text)

{
  uint8_t *puVar1;
  uint8_t *data;
  unsigned_long size;
  utf8_char_t *text_local;
  uint32_t timestamp_local;
  flvtag_t *tag_local;
  
  flvtag_initamf(tag,timestamp);
  data = (uint8_t *)strlen(text);
  if ((uint8_t *)0x10064 < data) {
    data = (uint8_t *)0x10064;
  }
  flvtag_reserve(tag,(int)data + 0x2e);
  puVar1 = flvtag_payload_data(tag);
  memcpy(puVar1,"\x02",0x2b);
  puVar1 = flvtag_payload_data(tag);
  memcpy(puVar1 + 0x2a,text,(size_t)data);
  puVar1[0x28] = (uint8_t)((ulong)data >> 8);
  puVar1[0x29] = (uint8_t)data;
  (puVar1 + 0x2a)[(long)data] = '\0';
  (puVar1 + 0x2b)[(long)data] = '\0';
  (puVar1 + 0x2c)[(long)data] = '\t';
  flvtag_updatesize(tag,(int)data + 0x2e);
  return 1;
}

Assistant:

int flvtag_amfcaption_utf8(flvtag_t* tag, uint32_t timestamp, const utf8_char_t* text)
{
    flvtag_initamf(tag, timestamp);
    unsigned long size = strlen(text);

    if (MAX_AMF_STRING < size) {
        size = MAX_AMF_STRING;
    }

    flvtag_reserve(tag, sizeof(onCaptionInfoUTF8) + size + 3);
    memcpy(flvtag_payload_data(tag), onCaptionInfoUTF8, sizeof(onCaptionInfoUTF8));
    uint8_t* data = flvtag_payload_data(tag) + sizeof(onCaptionInfo708);
    memcpy(data, text, size);
    // Update the size of the string
    data[-2] = size >> 8;
    data[-1] = size >> 0;
    // write the last array element
    data[size + 0] = 0x00;
    data[size + 1] = 0x00;
    data[size + 2] = 0x09;
    flvtag_updatesize(tag, sizeof(onCaptionInfoUTF8) + size + 3);

    return 1;
}